

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

void ts_subtree_balance(Subtree self,SubtreePool *pool,TSLanguage *language)

{
  uint32_t *puVar1;
  uint uVar2;
  Subtree *pSVar3;
  SubtreeHeapData *pSVar4;
  SubtreeHeapData *pSVar5;
  MutableSubtree self_00;
  MutableSubtree self_01;
  MutableSubtree self_02;
  MutableSubtree *pMVar6;
  uint uVar7;
  Subtree __nmemb;
  FILE *__s;
  Subtree unaff_RBX;
  uint uVar8;
  Subtree language_00;
  TSSymbol TVar9;
  Subtree SVar10;
  ulong uVar11;
  Subtree SStack_88;
  Subtree SStack_80;
  SubtreePool *pSStack_78;
  Subtree SStack_70;
  TSSymbol local_5e;
  uint local_5c;
  uint local_58;
  uint local_54;
  Subtree local_50;
  uint local_44;
  TSLanguage *local_40;
  Subtree local_38;
  
  (pool->tree_stack).size = 0;
  if (((((ulong)self.ptr & 1) == 0) && ((self.ptr)->child_count != 0)) &&
     ((self.ptr)->ref_count == 1)) {
    uVar8 = 0;
    if ((pool->tree_stack).capacity == 0) {
      SVar10 = (Subtree)(pool->tree_stack).contents;
      if ((MutableSubtree *)SVar10.ptr == (MutableSubtree *)0x0) {
        SVar10 = (Subtree)0x8;
        language_00 = (Subtree)0x8;
        SStack_70 = (Subtree)0x12f562;
        pMVar6 = (MutableSubtree *)calloc(8,8);
        if (pMVar6 == (MutableSubtree *)0x0) goto LAB_0012f905;
        uVar8 = 0;
      }
      else {
        language_00 = (Subtree)0x40;
        SStack_70 = (Subtree)0x12f544;
        pMVar6 = (MutableSubtree *)realloc(SVar10.ptr,0x40);
        if (pMVar6 == (MutableSubtree *)0x0) {
LAB_0012f900:
          SStack_70 = (Subtree)0x12f905;
          ts_subtree_balance_cold_1();
LAB_0012f905:
          SStack_70.ptr = (SubtreeHeapData *)ts_subtree_print_dot_graph;
          ts_subtree_balance_cold_6();
          SStack_88 = SVar10;
          SStack_80 = unaff_RBX;
          pSStack_78 = pool;
          SStack_70 = self;
          fwrite("digraph tree {\n",0xf,1,__s);
          fwrite("edge [arrowhead=none]\n",0x16,1,__s);
          ts_subtree__print_dot_graph(&SStack_88,0,(TSLanguage *)language_00.ptr,0,(FILE *)__s);
          fwrite("}\n",2,1,__s);
          return;
        }
        uVar8 = (pool->tree_stack).size;
      }
      (pool->tree_stack).contents = pMVar6;
      (pool->tree_stack).capacity = 8;
    }
    (pool->tree_stack).size = uVar8 + 1;
    (pool->tree_stack).contents[uVar8] = (MutableSubtree)self;
    uVar8 = (pool->tree_stack).size;
    local_40 = language;
    uVar2 = local_44;
    while (uVar8 != 0) {
      uVar8 = uVar8 - 1;
      uVar11 = (ulong)uVar8;
      (pool->tree_stack).size = uVar8;
      SVar10 = (Subtree)(pool->tree_stack).contents[uVar11].ptr;
      if (((SVar10.ptr)->field_17).field_0.repeat_depth != 0) {
        pSVar3 = ((SVar10.ptr)->field_17).field_0.children;
        pSVar4 = pSVar3->ptr;
        if ((((((ulong)pSVar4 & 1) == 0) && (pSVar4->child_count != 0)) &&
            ((pSVar5 = pSVar3[(SVar10.ptr)->child_count - 1].ptr, ((ulong)pSVar5 & 1) == 0 &&
             ((pSVar5->child_count != 0 &&
              (uVar7 = (pSVar4->field_17).field_0.repeat_depth,
              puVar1 = &(pSVar5->field_17).field_0.repeat_depth, local_44 = uVar7 - *puVar1,
              *puVar1 <= uVar7 && local_44 != 0)))))) && (local_50 = SVar10, 1 < local_44)) {
          do {
            uVar8 = local_44 >> 1;
            TVar9 = (local_50.ptr)->symbol;
            SVar10 = local_50;
            local_54 = local_44;
            local_44 = uVar8;
            while (((SVar10.ptr)->ref_count < 2 && (1 < (SVar10.ptr)->child_count))) {
              pSVar4 = (*(Subtree **)&(SVar10.ptr)->field_17)->ptr;
              if (((((ulong)pSVar4 & 1) != 0) ||
                  ((((pSVar4->child_count < 2 || (1 < pSVar4->ref_count)) ||
                    (pSVar4->symbol != TVar9)) ||
                   ((self = (Subtree)(*(Subtree **)&pSVar4->field_17)->ptr,
                    ((ulong)self.ptr & 1) != 0 || ((self.ptr)->child_count < 2)))))) ||
                 ((1 < (self.ptr)->ref_count || ((self.ptr)->symbol != TVar9)))) break;
              (*(Subtree **)&(SVar10.ptr)->field_17)->ptr = (SubtreeHeapData *)self;
              *(pSVar4->field_17).field_0.children =
                   ((self.ptr)->field_17).field_0.children[(self.ptr)->child_count - 1];
              ((self.ptr)->field_17).field_0.children[(self.ptr)->child_count - 1].ptr = pSVar4;
              uVar2 = (pool->tree_stack).size;
              unaff_RBX._4_4_ = 0;
              unaff_RBX._0_4_ = uVar2;
              if (uVar2 == (pool->tree_stack).capacity) {
                uVar7 = uVar2 * 2;
                if (uVar2 * 2 < 9) {
                  uVar7 = 8;
                }
                pMVar6 = (pool->tree_stack).contents;
                if (uVar2 < uVar7) {
                  __nmemb._4_4_ = 0;
                  __nmemb._0_4_ = uVar7;
                  local_5e = TVar9;
                  local_5c = uVar7;
                  local_58 = uVar8;
                  if (pMVar6 == (MutableSubtree *)0x0) {
                    language_00 = (Subtree)0x8;
                    SStack_70 = (Subtree)0x12f80b;
                    local_38 = __nmemb;
                    pMVar6 = (MutableSubtree *)calloc((size_t)__nmemb,8);
                    if (pMVar6 == (MutableSubtree *)0x0) goto LAB_0012f8f6;
                  }
                  else {
                    unaff_RBX.data = __nmemb.data << 3;
                    SStack_70 = (Subtree)0x12f7d6;
                    language_00.ptr = unaff_RBX.ptr;
                    pMVar6 = (MutableSubtree *)realloc(pMVar6,(size_t)unaff_RBX);
                    if (pMVar6 == (MutableSubtree *)0x0) goto LAB_0012f8ee;
                    unaff_RBX._4_4_ = 0;
                    unaff_RBX._0_4_ = (pool->tree_stack).size;
                  }
                  (pool->tree_stack).contents = pMVar6;
                  (pool->tree_stack).capacity = local_5c;
                  TVar9 = local_5e;
                  uVar8 = local_58;
                }
              }
              else {
                pMVar6 = (pool->tree_stack).contents;
              }
              (pool->tree_stack).size = unaff_RBX._0_4_ + 1;
              pMVar6[(long)unaff_RBX].ptr = (SubtreeHeapData *)SVar10;
              uVar8 = uVar8 - 1;
              SVar10 = self;
              if (uVar8 == 0) break;
            }
            uVar7 = local_54;
            uVar8 = (pool->tree_stack).size;
            SVar10 = local_50;
            while (local_50 = SVar10, (uint)uVar11 < uVar8) {
              (pool->tree_stack).size = uVar8 - 1;
              self_00 = (MutableSubtree)(pool->tree_stack).contents[uVar8 - 1].ptr;
              self_01 = (MutableSubtree)(((self_00.ptr)->field_17).field_0.children)->ptr;
              self_02 = (MutableSubtree)
                        ((self_01.ptr)->field_17).field_0.children[(self_01.ptr)->child_count - 1].
                        ptr;
              SStack_70 = (Subtree)0x12f880;
              ts_subtree_set_children
                        (self_02,((self_02.ptr)->field_17).field_0.children,
                         (self_02.ptr)->child_count,language);
              SStack_70 = (Subtree)0x12f895;
              ts_subtree_set_children
                        (self_01,((self_01.ptr)->field_17).field_0.children,
                         (self_01.ptr)->child_count,language);
              SStack_70 = (Subtree)0x12f8a8;
              ts_subtree_set_children
                        (self_00,((self_00.ptr)->field_17).field_0.children,
                         (self_00.ptr)->child_count,language);
              SVar10 = local_50;
              uVar8 = (pool->tree_stack).size;
            }
            uVar11 = (ulong)uVar8;
            uVar2 = local_44;
          } while (3 < uVar7);
        }
      }
      local_44 = uVar2;
      uVar7 = (SVar10.ptr)->child_count;
      uVar2 = local_44;
      if (uVar7 != 0) {
        uVar11 = 0;
        local_50 = SVar10;
        do {
          pSVar4 = ((SVar10.ptr)->field_17).field_0.children[uVar11].ptr;
          if (((((ulong)pSVar4 & 1) == 0) && (pSVar4->child_count != 0)) && (pSVar4->ref_count == 1)
             ) {
            uVar8 = (pool->tree_stack).size;
            unaff_RBX._4_4_ = 0;
            unaff_RBX._0_4_ = uVar8;
            if (uVar8 != (pool->tree_stack).capacity) {
              pMVar6 = (pool->tree_stack).contents;
LAB_0012f6a6:
              (pool->tree_stack).size = unaff_RBX._0_4_ + 1;
              pMVar6[(long)unaff_RBX].ptr = pSVar4;
              uVar7 = (SVar10.ptr)->child_count;
              goto LAB_0012f6b7;
            }
            uVar2 = uVar8 * 2;
            if (uVar8 * 2 < 9) {
              uVar2 = 8;
            }
            pMVar6 = (pool->tree_stack).contents;
            language = local_40;
            if (uVar2 <= uVar8) goto LAB_0012f6a6;
            self._4_4_ = 0;
            self._0_4_ = uVar2;
            if (pMVar6 == (MutableSubtree *)0x0) {
              language_00 = (Subtree)0x8;
              SStack_70 = (Subtree)0x12f68b;
              pMVar6 = (MutableSubtree *)calloc((size_t)self,8);
              if (pMVar6 != (MutableSubtree *)0x0) goto LAB_0012f694;
            }
            else {
              self.data = self.data << 3;
              SStack_70 = (Subtree)0x12f662;
              language_00.ptr = self.ptr;
              pMVar6 = (MutableSubtree *)realloc(pMVar6,(size_t)self);
              if (pMVar6 != (MutableSubtree *)0x0) {
                unaff_RBX._4_4_ = 0;
                unaff_RBX._0_4_ = (pool->tree_stack).size;
LAB_0012f694:
                (pool->tree_stack).contents = pMVar6;
                (pool->tree_stack).capacity = uVar2;
                language = local_40;
                SVar10 = local_50;
                goto LAB_0012f6a6;
              }
              SStack_70 = (Subtree)0x12f8e6;
              ts_subtree_balance_cold_4();
            }
            SStack_70 = (Subtree)0x12f8ee;
            ts_subtree_balance_cold_5();
LAB_0012f8ee:
            SStack_70 = (Subtree)0x12f8f6;
            ts_subtree_balance_cold_2();
LAB_0012f8f6:
            SStack_70 = (Subtree)0x12f900;
            SVar10 = local_38;
            ts_subtree_balance_cold_3();
            goto LAB_0012f900;
          }
LAB_0012f6b7:
          uVar11 = uVar11 + 1;
        } while (uVar11 < uVar7);
        uVar8 = (pool->tree_stack).size;
        uVar2 = local_44;
      }
    }
  }
  return;
}

Assistant:

void ts_subtree_balance(Subtree self, SubtreePool *pool, const TSLanguage *language) {
  array_clear(&pool->tree_stack);

  if (ts_subtree_child_count(self) > 0 && self.ptr->ref_count == 1) {
    array_push(&pool->tree_stack, ts_subtree_to_mut_unsafe(self));
  }

  while (pool->tree_stack.size > 0) {
    MutableSubtree tree = array_pop(&pool->tree_stack);

    if (tree.ptr->repeat_depth > 0) {
      Subtree child1 = tree.ptr->children[0];
      Subtree child2 = tree.ptr->children[tree.ptr->child_count - 1];
      if (
        ts_subtree_child_count(child1) > 0 &&
        ts_subtree_child_count(child2) > 0 &&
        child1.ptr->repeat_depth > child2.ptr->repeat_depth
      ) {
        unsigned n = child1.ptr->repeat_depth - child2.ptr->repeat_depth;
        for (unsigned i = n / 2; i > 0; i /= 2) {
          ts_subtree__compress(tree, i, language, &pool->tree_stack);
          n -= i;
        }
      }
    }

    for (uint32_t i = 0; i < tree.ptr->child_count; i++) {
      Subtree child = tree.ptr->children[i];
      if (ts_subtree_child_count(child) > 0 && child.ptr->ref_count == 1) {
        array_push(&pool->tree_stack, ts_subtree_to_mut_unsafe(child));
      }
    }
  }
}